

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cc
# Opt level: O2

Uint wabt::anon_unknown_0::FloatParser<double>::Make(bool sign,int exp,Uint sig)

{
  if (sig >> 0x34 == 0) {
    return (ulong)(exp + 0x3ff) << 0x34 | (ulong)sign << 0x3f | sig;
  }
  __assert_fail("sig <= Traits::kSigMask",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/literal.cc"
                ,0xb9,
                "static typename FloatParser<T>::Uint wabt::(anonymous namespace)::FloatParser<double>::Make(bool, int, Uint) [T = double]"
               );
}

Assistant:

typename FloatParser<T>::Uint FloatParser<T>::Make(bool sign,
                                                   int exp,
                                                   Uint sig) {
  assert(exp >= Traits::kMinExp && exp <= Traits::kMaxExp);
  assert(sig <= Traits::kSigMask);
  return (Uint(sign) << Traits::kSignShift) |
         (Uint(exp + Traits::kExpBias) << Traits::kSigBits) | sig;
}